

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search.c
# Opt level: O2

ps_seg_t * ngram_search_seg_iter(ps_search_t *search)

{
  cmd_ln_t **tm;
  short sVar1;
  int iVar2;
  ps_lattice_t *dag;
  ps_latlink_t *link;
  ps_seg_t *ppVar3;
  long lVar4;
  ps_segfuncs_t *ppVar5;
  int iVar6;
  int *piVar7;
  int backward;
  float32 fVar8;
  double dVar9;
  
  if ((*(char *)((long)&search[1].name + 2) == '\0') ||
     (*(char *)((long)&search[1].name + 3) == '\0')) {
    iVar2 = ngram_search_find_exit((ngram_search_t *)search,-1,(int32 *)0x0);
    fVar8 = 1.0;
    if ((*(char *)((long)&search[1].name + 3) != '\0') &&
       (fVar8 = 1.0, *(char *)((long)&search[1].name + 1) != '\0')) {
      fVar8 = *(float32 *)((long)&search[3].dag + 4);
    }
    ppVar3 = (ps_seg_t *)
             __ckd_calloc__(1,0x48,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                            ,0x3c8);
    ppVar3->vt = &ngram_bp_segfuncs;
    ppVar3->search = search;
    ppVar3->lwf = fVar8;
    sVar1 = 0;
    for (iVar6 = iVar2; iVar6 != -1;
        iVar6 = *(int *)(*(long *)&search[2].post + 0xc + (long)iVar6 * 0x24)) {
      sVar1 = sVar1 + 1;
    }
    *(short *)&ppVar3[1].search = sVar1;
    if (sVar1 != 0) {
      ppVar5 = (ps_segfuncs_t *)
               __ckd_calloc__((long)sVar1,4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                              ,0x3d7);
      ppVar3[1].vt = ppVar5;
      piVar7 = (int *)((long)&ppVar5->seg_next + (long)*(short *)&ppVar3[1].search * 4);
      for (; piVar7 = piVar7 + -1, iVar2 != -1; iVar2 = *(int *)(lVar4 + 0xc + (long)iVar2 * 0x24))
      {
        lVar4 = *(long *)&search[2].post;
        *piVar7 = iVar2;
      }
      ngram_search_bp2itor(ppVar3,*(int *)&ppVar5->seg_next);
      return ppVar3;
    }
    ckd_free(ppVar3);
  }
  else {
    tm = &search[5].config;
    ptmr_reset((ptmr_t *)tm);
    ptmr_start((ptmr_t *)tm);
    dag = ngram_search_lattice(search);
    if (dag != (ps_lattice_t *)0x0) {
      link = ngram_search_bestpath(search,(int32 *)0x0,backward);
      if (link == (ps_latlink_t *)0x0) {
        return (ps_seg_t *)0x0;
      }
      ppVar3 = ps_lattice_seg_iter(dag,link,(float32)search[3].n_words);
      ptmr_stop((ptmr_t *)tm);
      iVar2 = dag->n_frames;
      lVar4 = ps_config_int(search->config,"frate");
      dVar9 = (double)iVar2 / (double)lVar4;
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
              ,0x400,"bestpath %.2f CPU %.3f xRT\n",search[5].acmod,(double)search[5].acmod / dVar9)
      ;
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
              ,0x403,"bestpath %.2f wall %.3f xRT\n",search[5].dict,(double)search[5].dict / dVar9);
      return ppVar3;
    }
  }
  return (ps_seg_t *)0x0;
}

Assistant:

static ps_seg_t *
ngram_search_seg_iter(ps_search_t *search)
{
    ngram_search_t *ngs = (ngram_search_t *)search;

    /* Only do bestpath search if the utterance is done. */
    if (ngs->bestpath && ngs->done) {
        ps_lattice_t *dag;
        ps_latlink_t *link;
        double n_speech;
        ps_seg_t *itor;

        ptmr_reset(&ngs->bestpath_perf);
        ptmr_start(&ngs->bestpath_perf);
        if ((dag = ngram_search_lattice(search)) == NULL)
            return NULL;
        if ((link = ngram_search_bestpath(search, NULL, TRUE)) == NULL)
            return NULL;
        itor = ps_lattice_seg_iter(dag, link,
                                   ngs->bestpath_fwdtree_lw_ratio);
        ptmr_stop(&ngs->bestpath_perf);
        n_speech = (double)dag->n_frames
            / ps_config_int(ps_search_config(ngs), "frate");
        E_INFO("bestpath %.2f CPU %.3f xRT\n",
               ngs->bestpath_perf.t_cpu,
               ngs->bestpath_perf.t_cpu / n_speech);
        E_INFO("bestpath %.2f wall %.3f xRT\n",
               ngs->bestpath_perf.t_elapsed,
               ngs->bestpath_perf.t_elapsed / n_speech);
        return itor;
    }
    else {
        int32 bpidx;

        /* fwdtree and fwdflat use same backpointer table. */
        bpidx = ngram_search_find_exit(ngs, -1, NULL);
        return ngram_search_bp_iter(ngs, bpidx,
                                    /* but different language weights... */
                                    (ngs->done && ngs->fwdflat)
                                    ? ngs->fwdflat_fwdtree_lw_ratio : 1.0);
    }

    return NULL;
}